

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O3

bool bssl::ext_key_share_add_clienthello
               (SSL_HANDSHAKE *hs,CBB *out,CBB *out_compressible,ssl_client_hello_type_t type)

{
  bool bVar1;
  int iVar2;
  CBB kse_bytes;
  CBB contents;
  CBB local_70;
  CBB local_40;
  
  bVar1 = true;
  if ((0x303 < hs->max_version) &&
     ((hs->pake_prover)._M_t.
      super___uniq_ptr_impl<bssl::spake2plus::Prover,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_bssl::spake2plus::Prover_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_bssl::spake2plus::Prover_*,_false>._M_head_impl == (Prover *)0x0)) {
    if ((hs->key_share_bytes).size_ == 0) {
      __assert_fail("!hs->key_share_bytes.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0x8e6,
                    "bool bssl::ext_key_share_add_clienthello(const SSL_HANDSHAKE *, CBB *, CBB *, ssl_client_hello_type_t)"
                   );
    }
    iVar2 = CBB_add_u16(out_compressible,0x33);
    if ((((iVar2 != 0) &&
         (iVar2 = CBB_add_u16_length_prefixed(out_compressible,&local_40), iVar2 != 0)) &&
        (iVar2 = CBB_add_u16_length_prefixed(&local_40,&local_70), iVar2 != 0)) &&
       (iVar2 = CBB_add_bytes(&local_70,(hs->key_share_bytes).data_,(hs->key_share_bytes).size_),
       iVar2 != 0)) {
      iVar2 = CBB_flush(out_compressible);
      return iVar2 != 0;
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

static bool ext_key_share_add_clienthello(const SSL_HANDSHAKE *hs, CBB *out,
                                          CBB *out_compressible,
                                          ssl_client_hello_type_t type) {
  // If offering a PAKE, do not set up key shares. We do not currently support
  // clients offering both PAKE and non-PAKE modes, including resumption.
  if (hs->max_version < TLS1_3_VERSION || hs->pake_prover) {
    return true;
  }

  assert(!hs->key_share_bytes.empty());
  CBB contents, kse_bytes;
  if (!CBB_add_u16(out_compressible, TLSEXT_TYPE_key_share) ||
      !CBB_add_u16_length_prefixed(out_compressible, &contents) ||
      !CBB_add_u16_length_prefixed(&contents, &kse_bytes) ||
      !CBB_add_bytes(&kse_bytes, hs->key_share_bytes.data(),
                     hs->key_share_bytes.size()) ||
      !CBB_flush(out_compressible)) {
    return false;
  }

  return true;
}